

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvector-generator.cpp
# Opt level: O2

void __thiscall train_context::build_v_diff(train_context *this,bool transpose)

{
  pointer __src;
  ulong uVar1;
  ggml_tensor *pgVar2;
  size_t sVar3;
  void *__dest;
  int iVar4;
  int iVar5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  int iVar6;
  ulong uVar7;
  undefined7 in_register_00000031;
  value_type *__x;
  int ic;
  int iVar8;
  float *arr;
  long lVar9;
  ggml_tensor *diff;
  allocator<char> local_c1;
  ggml_tensor *local_c0;
  undefined4 local_b4;
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *local_b0;
  long local_a8;
  long local_a0;
  pointer local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_b4 = (undefined4)CONCAT71(in_register_00000031,transpose);
  puts("build_v_diff");
  local_b0 = &this->v_diff;
  lVar9 = 0;
  while( true ) {
    if ((long)this->n_layers + -1 <= lVar9) {
      return;
    }
    local_98 = (this->v_diff_tmp).
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_a0 = lVar9 * 0x18;
    uVar1 = (ulong)((long)*(pointer *)
                           ((long)&local_98[lVar9].
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data + 8) -
                   *(long *)&local_98[lVar9].
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data) >> 2;
    iVar5 = this->n_embd;
    uVar1 = (ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff;
    uVar7 = (long)uVar1 / (long)iVar5;
    if ((int)((long)uVar1 % (long)iVar5) != 0) break;
    iVar6 = (int)uVar7;
    iVar4 = iVar5;
    iVar8 = iVar6;
    if ((char)local_b4 == '\0') {
      iVar4 = iVar6;
      iVar8 = iVar5;
    }
    pgVar2 = (ggml_tensor *)ggml_new_tensor_2d(this->ctx_ggml,0,(long)iVar8,(long)iVar4);
    local_c0 = pgVar2;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"diff_",&local_c1);
    std::__cxx11::to_string(&local_50,(int)lVar9);
    std::operator+(&local_90,&local_70,&local_50);
    local_a8 = lVar9;
    ggml_set_name(pgVar2,local_90._M_dataplus._M_p);
    this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
              ((long)&(local_98->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data + local_a0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    sVar3 = ggml_nbytes(local_c0);
    __dest = malloc(sVar3);
    local_c0->data = __dest;
    __src = (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start;
    if ((char)local_b4 == '\0') {
      sVar3 = ggml_nbytes();
      memcpy(__dest,__src,sVar3);
    }
    else {
      uVar7 = uVar7 & 0xffffffff;
      iVar5 = 0;
      if (iVar6 < 1) {
        uVar7 = 0;
        iVar5 = 0;
      }
      for (; iVar5 != (int)uVar7; iVar5 = iVar5 + 1) {
        for (iVar8 = 0; iVar8 < this->n_embd; iVar8 = iVar8 + 1) {
          ggml_set_f32_nd(*(undefined4 *)(__src + (long)(this->n_embd * iVar5 + iVar8) * 4),local_c0
                          ,iVar5,iVar8,0,0);
        }
      }
    }
    __x = &local_c0;
    std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::push_back(local_b0,__x);
    print_debug_tensor(local_c0,SUB81(__x,0));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_00,0);
    lVar9 = local_a8 + 1;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/cvector-generator/cvector-generator.cpp"
             ,0xeb,"GGML_ASSERT(%s) failed","n_elem % n_embd == 0");
}

Assistant:

void build_v_diff(bool transpose) {
        printf("build_v_diff\n");
        for (int il = 0; il < n_layers - 1; il++) {
            auto & diff_tmp = v_diff_tmp[il];
            int n_elem = diff_tmp.size() / sizeof(float);
            GGML_ASSERT(n_elem % n_embd == 0);
            int n_rows = n_elem / n_embd;
            struct ggml_tensor * diff = transpose
                ? ggml_new_tensor_2d(ctx_ggml, GGML_TYPE_F32, n_rows, n_embd)
                : ggml_new_tensor_2d(ctx_ggml, GGML_TYPE_F32, n_embd, n_rows);
            ggml_set_name(diff, (std::string("diff_") + std::to_string(il)).c_str());
            diff->data = malloc(ggml_nbytes(diff)); // TODO: get rid of this malloc if possible
            if (transpose) {
                // copy data & transpose
                float * arr = (float *) diff_tmp.data();
                for (int ir = 0; ir < n_rows; ++ir) {
                    for (int ic = 0; ic < n_embd; ++ic) {
                        float f = arr[ir*n_embd + ic];
                        ggml_set_f32_nd(diff, ir, ic, 0, 0, f);
                    }
                }
            } else {
                // only copy
                memcpy(diff->data, diff_tmp.data(), ggml_nbytes(diff));
            }
            v_diff.push_back(diff);
            print_debug_tensor(diff);
            // free memory of diff_tmp
            diff_tmp.resize(0);
        }
    }